

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  pointer pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  element_type *peVar7;
  int iVar8;
  _func_int **pp_Var9;
  _Node *p_Var10;
  element_type *peVar11;
  long lVar12;
  iterator iVar13;
  long *plVar14;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  ptr<peer> pp;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  uint local_a0;
  log_val_type local_9a;
  undefined1 local_99;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  string local_88;
  undefined1 local_68 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_a0 = srv_id;
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    get_config((raft_server *)local_68);
    peVar11 = (this->uncommitted_config_).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar11 != (element_type *)0x0) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar8 = (**(code **)(*(long *)peVar3 + 0x38))();
        peVar11 = (this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (3 < iVar8) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_88,"uncommitted config exists at log %lu, prev log %lu",
                     peVar11->log_idx_,peVar11->prev_log_idx_);
          (**(code **)(*(long *)peVar3 + 0x40))
                    (peVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"rm_srv_from_cluster",0x1ee,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          peVar11 = (this->uncommitted_config_).
                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
      }
      local_68._0_8_ = peVar11;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    pp_Var9 = (_func_int **)
              (**(code **)(*(long *)(this->log_store_).
                                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x10))();
    uVar5 = *(undefined4 *)(ulong *)local_68._0_8_;
    uVar6 = *(undefined4 *)((long)(ulong *)local_68._0_8_ + 4);
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    (local_90._M_pi)->_M_use_count = 1;
    (local_90._M_pi)->_M_weak_count = 1;
    (local_90._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b1af8;
    local_98 = (element_type *)(local_90._M_pi + 1);
    local_90._M_pi[1]._vptr__Sp_counted_base = pp_Var9;
    local_90._M_pi[1]._M_use_count = uVar5;
    local_90._M_pi[1]._M_weak_count = uVar6;
    *(undefined1 *)&local_90._M_pi[2]._vptr__Sp_counted_base = 0;
    *(_Atomic_word **)&local_90._M_pi[2]._M_use_count = &local_90._M_pi[3]._M_use_count;
    local_90._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&local_90._M_pi[3]._M_use_count = 0;
    local_90._M_pi[5]._vptr__Sp_counted_base = (_func_int **)&local_90._M_pi[4]._M_use_count;
    *(_Atomic_word **)&local_90._M_pi[4]._M_use_count = &local_90._M_pi[4]._M_use_count;
    local_90._M_pi[5]._M_use_count = 0;
    local_90._M_pi[5]._M_weak_count = 0;
    plVar14 = (long *)(((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         *)(local_68._0_8_ + 0x38))->
                      super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next;
    peVar11 = (element_type *)local_68._0_8_;
    if ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         *)plVar14 !=
        (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         *)(local_68._0_8_ + 0x38)) {
      do {
        peVar7 = local_98;
        if (*(uint *)plVar14[2] != local_a0) {
          p_Var10 = std::__cxx11::
                    list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                    ::_M_create_node<std::shared_ptr<nuraft::srv_config>const&>
                              ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                                *)&local_98->servers_,
                               (shared_ptr<nuraft::srv_config> *)(plVar14 + 2));
          std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
          psVar1 = &(peVar7->servers_).
                    super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          peVar11 = (element_type *)local_68._0_8_;
        }
        plVar14 = (long *)*plVar14;
      } while ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)plVar14 != &peVar11->servers_);
    }
    peVar7 = local_98;
    paVar2 = &local_88.field_2;
    pcVar4 = (peVar11->user_ctx_)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar4,pcVar4 + (peVar11->user_ctx_)._M_string_length);
    std::__cxx11::string::_M_assign((string *)&peVar7->user_ctx_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_98->async_replication_ = *(bool *)(local_68._0_8_ + 0x10);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (iVar8 = (**(code **)(*(long *)peVar3 + 0x38))(), 3 < iVar8)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_88,
                 "removed server %d from configuration and save the configuration to log store at %lu"
                 ,(ulong)local_a0,local_98->log_idx_);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"rm_srv_from_cluster",0x203,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    this->config_changing_ = true;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_90);
    cluster_config::serialize((cluster_config *)&stack0xffffffffffffffc8);
    local_88._M_dataplus._M_p =
         (pointer)(((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_9a = conf;
    lVar12 = std::chrono::_V2::system_clock::now();
    local_68._16_8_ = lVar12 / 1000;
    local_68._32_8_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_40,(log_entry **)(local_68 + 0x20),(allocator<nuraft::log_entry> *)&local_99,
               (unsigned_long *)&local_88,(shared_ptr<nuraft::buffer> *)&stack0xffffffffffffffc8,
               &local_9a,(unsigned_long *)(local_68 + 0x10));
    store_log_entry(this,(ptr<log_entry> *)(local_68 + 0x20),0);
    iVar13 = std::
             _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->peers_)._M_h,(key_type *)&local_a0);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_68._16_8_ =
           *(long *)((long)iVar13.
                           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                           ._M_cur + 0x10);
      local_68._24_8_ =
           *(native_handle_type *)
            ((long)iVar13.
                   super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                   ._M_cur + 0x18);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_68._24_8_ + 8) = *(_Atomic_word *)(local_68._24_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_68._24_8_ + 8) = *(_Atomic_word *)(local_68._24_8_ + 8) + 1;
        }
      }
      (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68._16_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
      this->srv_to_leave_target_idx_ = local_98->log_idx_;
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) &&
         (iVar8 = (**(code **)(*(long *)peVar3 + 0x38))(), 3 < iVar8)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_88,"set srv_to_leave_, server %d will be removed from cluster, config %lu"
                   ,(ulong)local_a0,this->srv_to_leave_target_idx_);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"rm_srv_from_cluster",0x215,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      if (local_68._24_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_);
      }
    }
    request_append_entries(this);
    if ((EventAwaiter *)local_40._M_pi != (EventAwaiter *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
    }
    if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  else {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (iVar8 = (**(code **)(*(long *)peVar3 + 0x38))(), 2 < iVar8)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_88,"to-be-removed server %d already exists, cannot remove server %d for now"
                 ,(ulong)(uint)((((this->srv_to_leave_).
                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id_,(ulong)(uint)srv_id);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"rm_srv_from_cluster",0x1e3,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id) {
    if (srv_to_leave_) {
        p_wn("to-be-removed server %d already exists, "
             "cannot remove server %d for now",
             srv_to_leave_->get_id(), srv_id);
        return;
    }

    ptr<cluster_config> cur_conf = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_conf = uncommitted_config_;
    }

    ptr<cluster_config> new_conf = cs_new<cluster_config>
                                   ( log_store_->next_slot(),
                                     cur_conf->get_log_idx() );
    for (auto it = cur_conf->get_servers().cbegin();
          it != cur_conf->get_servers().cend();
          ++it ) {
        if ((*it)->get_id() != srv_id) {
            new_conf->get_servers().push_back(*it);
        }
    }
    new_conf->set_user_ctx( cur_conf->get_user_ctx() );
    new_conf->set_async_replication
              ( cur_conf->is_async_replication() );

    p_in( "removed server %d from configuration and "
          "save the configuration to log store at %" PRIu64,
          srv_id,
          new_conf->get_log_idx() );

    config_changing_ = true;
    uncommitted_config_ = new_conf;
    ptr<buffer> new_conf_buf( new_conf->serialize() );
    ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                             new_conf_buf,
                                             log_val_type::conf,
                                             timer_helper::get_timeofday_us() ) );
    store_log_entry(entry);

    auto p_entry = peers_.find(srv_id);
    if (p_entry != peers_.end()) {
        ptr<peer> pp = p_entry->second;
        srv_to_leave_ = pp;
        srv_to_leave_target_idx_ = new_conf->get_log_idx();
        p_in("set srv_to_leave_, "
             "server %d will be removed from cluster, config %" PRIu64,
             srv_id, srv_to_leave_target_idx_);
    }

    request_append_entries();
}